

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults> * __thiscall
kj::_::
convertToReturn<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>>
          (Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>
           *__return_storage_ptr__,_ *this,
          ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>_>
          *result)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ResponseHook *pRVar7;
  Exception *exception_1;
  
  if (this[0x198] == (_)0x1) {
    if (*this != (_)0x0) {
      throwRecoverableException((Exception *)(this + 8),0);
    }
    pSVar1 = *(SegmentReader **)(this + 0x1a0);
    pCVar2 = *(CapTableReader **)(this + 0x1a8);
    pvVar3 = *(void **)(this + 0x1b0);
    pWVar4 = *(WirePointer **)(this + 0x1b8);
    uVar5 = *(undefined8 *)(this + 0x1c0);
    uVar6 = *(undefined8 *)(this + 0x1c8);
    (__return_storage_ptr__->super_Reader)._reader.dataSize = (int)uVar5;
    (__return_storage_ptr__->super_Reader)._reader.pointerCount = (short)((ulong)uVar5 >> 0x20);
    *(short *)&(__return_storage_ptr__->super_Reader)._reader.field_0x26 =
         (short)((ulong)uVar5 >> 0x30);
    *(undefined8 *)&(__return_storage_ptr__->super_Reader)._reader.nestingLimit = uVar6;
    (__return_storage_ptr__->super_Reader)._reader.data = pvVar3;
    (__return_storage_ptr__->super_Reader)._reader.pointers = pWVar4;
    (__return_storage_ptr__->super_Reader)._reader.segment = pSVar1;
    (__return_storage_ptr__->super_Reader)._reader.capTable = pCVar2;
    pRVar7 = *(ResponseHook **)(this + 0x1d8);
    (__return_storage_ptr__->hook).disposer = *(Disposer **)(this + 0x1d0);
    (__return_storage_ptr__->hook).ptr = pRVar7;
    *(undefined8 *)(this + 0x1d8) = 0;
    return __return_storage_ptr__;
  }
  if (*this != (_)0x0) {
    throwFatalException((Exception *)(this + 8),0);
  }
  unreachable();
}

Assistant:

inline T convertToReturn(ExceptionOr<T>&& result) {
  KJ_IF_SOME(value, result.value) {
    KJ_IF_SOME(exception, result.exception) {
      throwRecoverableException(kj::mv(exception));
    }
    return _::returnMaybeVoid(kj::mv(value));
  } else KJ_IF_SOME(exception, result.exception) {
    throwFatalException(kj::mv(exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }